

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Channel.cc
# Opt level: O3

void __thiscall tt::net::Channel::~Channel(Channel *this)

{
  _Atomic_word *p_Var1;
  _Manager_type p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  int iVar4;
  
  p_Var2 = (this->m_connHandler).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->m_connHandler,(_Any_data *)&this->m_connHandler,__destroy_functor)
    ;
  }
  p_Var2 = (this->m_errorHandler).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->m_errorHandler,(_Any_data *)&this->m_errorHandler,
              __destroy_functor);
  }
  p_Var2 = (this->m_writeHandler).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->m_writeHandler,(_Any_data *)&this->m_writeHandler,
              __destroy_functor);
  }
  p_Var2 = (this->m_readHandler).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->m_readHandler,(_Any_data *)&this->m_readHandler,__destroy_functor)
    ;
  }
  p_Var3 = (this->m_holder).super___weak_ptr<tt::net::HttpData,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var3->_M_weak_count;
      iVar4 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar4 = p_Var3->_M_weak_count;
      p_Var3->_M_weak_count = iVar4 + -1;
    }
    if (iVar4 == 1) {
      (*p_Var3->_vptr__Sp_counted_base[3])();
      return;
    }
  }
  return;
}

Assistant:

Channel::~Channel(){}